

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::lts_20240722::Cord::RemoveSuffix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  char *pcVar2;
  uint uVar3;
  byte bVar4;
  uint8_t uVar5;
  ulong uVar6;
  CordRepBtree *pCVar7;
  long lVar8;
  ulong extraout_RAX;
  ulong uVar9;
  CordRep *pCVar10;
  size_t sVar11;
  CordRepBtree *pCVar12;
  CordRepBtree *pCVar13;
  CordzUpdateScope scope;
  string death_message;
  undefined1 local_130 [32];
  AlphaNum local_110;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  AlphaNum local_c0;
  AlphaNum local_90;
  long local_60;
  char *local_58;
  char local_50 [32];
  
  bVar4 = (this->contents_).data_.rep_.field_0.data[0];
  uVar6 = (ulong)(char)bVar4;
  if ((uVar6 & 1) == 0) {
    uVar9 = uVar6 >> 1;
  }
  else {
    uVar9 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar9 < n) {
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Check n <= size() failed: ","");
    local_c0.piece_._M_len = 0x16;
    local_c0.piece_._M_str = "Requested suffix size ";
    pcVar2 = local_110.digits_;
    lVar8 = absl::lts_20240722::numbers_internal::FastIntToBuffer(n,pcVar2);
    local_110.piece_._M_len = lVar8 - (long)pcVar2;
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    uVar6 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar6 & 1) == 0) {
      sVar11 = uVar6 >> 1;
    }
    else {
      sVar11 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    local_110.piece_._M_str = pcVar2;
    local_60 = absl::lts_20240722::numbers_internal::FastIntToBuffer(sVar11,local_50);
    local_60 = local_60 - (long)local_50;
    local_58 = local_50;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_130,&local_c0,&local_110,&local_90);
    std::__cxx11::string::_M_append((char *)local_e0,local_130._0_8_);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    (*raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
               ,0x2c5,local_e0);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  pCVar12 = (CordRepBtree *)(this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar12 == (CordRepBtree *)0x0 || (bVar4 & 1) == 0) || ((pCVar12->super_CordRep).length != 0)
     ) {
    if (pCVar12 == (CordRepBtree *)0x0 || (uVar6 & 1) == 0) {
      if ((bVar4 & 1) != 0) {
        RemoveSuffix();
        goto LAB_0010c9d7;
      }
      if (0x1f < bVar4) {
        __assert_fail("tag <= kMaxInline",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
                      ,0xb9,"void absl::Cord::InlineRep::reduce_size(size_t)");
      }
      uVar6 = (ulong)(bVar4 >> 1);
      goto LAB_0010c78b;
    }
    local_110.piece_._M_len = (size_t)cord_internal::InlineData::cordz_info((InlineData *)this);
    if ((CordzInfo *)local_110.piece_._M_len != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_110.piece_._M_len);
    }
    pCVar13 = pCVar12;
    if (((pCVar12->super_CordRep).tag == '\x02') &&
       (RemoveSuffix(), pCVar13 = (CordRepBtree *)local_c0.piece_._M_len, (extraout_RAX & 1) == 0))
    {
      LOCK();
      pRVar1 = &((CordRep *)local_c0.piece_._M_len)->refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      cord_internal::CordRep::Unref((CordRep *)pCVar12);
    }
    uVar6 = (pCVar13->super_CordRep).length;
    if (n < uVar6) {
      uVar5 = (pCVar13->super_CordRep).tag;
      if (uVar5 == '\x05') {
LAB_0010c864:
        if (uVar6 - n == 0) {
          __assert_fail("n != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a2,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if (uVar6 == 0) {
          __assert_fail("pos < rep->length",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a3,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if (uVar6 < n) {
          __assert_fail("n <= rep->length - pos",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a4,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if (n == 0) {
          LOCK();
          pRVar1 = &(pCVar13->super_CordRep).refcount;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + 2;
          UNLOCK();
          n = (size_t)pCVar13;
        }
        else {
          if ((pCVar13->super_CordRep).tag == '\x01') {
            pCVar10 = pCVar13->edges_[0];
            pCVar12 = (CordRepBtree *)pCVar13->edges_[1];
          }
          else {
            pCVar10 = (CordRep *)0x0;
            pCVar12 = pCVar13;
          }
          pCVar7 = (CordRepBtree *)operator_new(0x20);
          (pCVar7->super_CordRep).length = 0;
          (pCVar7->super_CordRep).refcount = (atomic<int>)0x0;
          (pCVar7->super_CordRep).tag = '\0';
          (pCVar7->super_CordRep).storage[0] = '\0';
          (pCVar7->super_CordRep).storage[1] = '\0';
          (pCVar7->super_CordRep).storage[2] = '\0';
          (pCVar7->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          (pCVar7->super_CordRep).length = uVar6 - n;
          (pCVar7->super_CordRep).tag = '\x01';
          pCVar7->edges_[0] = pCVar10;
          if (pCVar12 == (CordRepBtree *)0x0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          pRVar1 = &(pCVar12->super_CordRep).refcount;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + 2;
          UNLOCK();
          pCVar7->edges_[1] = &pCVar12->super_CordRep;
          n = (size_t)pCVar7;
        }
        LOCK();
        pRVar1 = &(pCVar13->super_CordRep).refcount;
        uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + -2;
        UNLOCK();
        if ((uVar3 & 1) == 0 && (int)uVar3 < 1) {
LAB_0010cb74:
          __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0xaa,
                        "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()")
          ;
        }
        if (uVar3 == 2) {
          absl::lts_20240722::cord_internal::CordRep::Destroy(&pCVar13->super_CordRep);
        }
      }
      else if (uVar5 == '\x03') {
        n = absl::lts_20240722::cord_internal::CordRepBtree::RemoveSuffix(pCVar13,n);
      }
      else {
        if ((pCVar13->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
          uVar6 = (pCVar13->super_CordRep).length;
          goto LAB_0010c864;
        }
        bVar4 = (pCVar13->super_CordRep).tag;
        if (bVar4 != 1 && bVar4 < 6) {
          __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
                        ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
        }
        (pCVar13->super_CordRep).length = (pCVar13->super_CordRep).length - n;
        n = (size_t)pCVar13;
      }
    }
    else {
      LOCK();
      pRVar1 = &(pCVar13->super_CordRep).refcount;
      uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar3 & 1) == 0 && (int)uVar3 < 1) goto LAB_0010cb74;
      if (uVar3 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(&pCVar13->super_CordRep);
      }
      n = 0;
    }
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x508,
                    "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if ((CordRepBtree *)n == (CordRepBtree *)0x0) {
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    }
    else {
      (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)n;
    }
    this = (Cord *)local_110.piece_._M_len;
    if ((CordzInfo *)local_110.piece_._M_len == (CordzInfo *)0x0) goto LAB_0010c92e;
  }
  else {
LAB_0010c9d7:
    RemoveSuffix();
    uVar6 = 0;
LAB_0010c78b:
    uVar9 = uVar6 - n;
    if (uVar6 < n) {
      __assert_fail("tag >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0xba,"void absl::Cord::InlineRep::reduce_size(size_t)");
    }
    memset((void *)((long)this + uVar9 + 1),0,n);
    if (uVar9 < 0x10) {
      (this->contents_).data_.rep_.field_0.data[0] = (char)uVar9 * '\x02';
      return;
    }
    RemoveSuffix();
  }
  absl::lts_20240722::Mutex::AssertHeld();
  *(size_t *)((long)this + 0x40) = n;
LAB_0010c92e:
  cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&local_110);
  return;
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}